

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.c
# Opt level: O0

int bech32_decode(char *hrp,uint8_t *data,size_t *data_len,char *input,size_t max_input_len,
                 _Bool *is_bech32m)

{
  size_t sVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  bool local_79;
  uint local_78;
  int local_6c;
  int v;
  int ch;
  int have_upper;
  int have_lower;
  size_t hrp_len;
  size_t input_len;
  size_t i;
  uint32_t chk;
  _Bool *is_bech32m_local;
  size_t max_input_len_local;
  char *input_local;
  size_t *data_len_local;
  uint8_t *data_local;
  char *hrp_local;
  
  i._4_4_ = 1;
  sVar5 = strlen(input);
  bVar2 = false;
  bVar3 = false;
  if ((sVar5 < 8) || (max_input_len < sVar5)) {
    hrp_local._4_4_ = 0;
  }
  else {
    *data_len = 0;
    while( true ) {
      bVar8 = false;
      if (*data_len < sVar5) {
        bVar8 = input[(sVar5 - 1) - *data_len] != '1';
      }
      if (!bVar8) break;
      *data_len = *data_len + 1;
    }
    if ((*data_len + 1 < sVar5) && (5 < *data_len)) {
      uVar6 = sVar5 - (*data_len + 1);
      *data_len = *data_len - 6;
      for (input_len = 0; input_len < uVar6; input_len = input_len + 1) {
        local_6c = (int)input[input_len];
        if ((local_6c < 0x21) || (0x7e < local_6c)) {
          return 0;
        }
        if ((local_6c < 0x61) || (0x7a < local_6c)) {
          if ((0x40 < local_6c) && (local_6c < 0x5b)) {
            bVar3 = true;
            local_6c = local_6c + 0x20;
          }
        }
        else {
          bVar2 = true;
        }
        hrp[input_len] = (char)local_6c;
        uVar4 = bech32_polymod_step(i._4_4_);
        i._4_4_ = uVar4 ^ local_6c >> 5;
      }
      hrp[input_len] = '\0';
      i._4_4_ = bech32_polymod_step(i._4_4_);
      for (input_len = 0; sVar1 = input_len, input_len < uVar6; input_len = input_len + 1) {
        uVar4 = bech32_polymod_step(i._4_4_);
        i._4_4_ = uVar4 ^ (int)input[input_len] & 0x1fU;
      }
      while (input_len = sVar1 + 1, input_len < sVar5) {
        if (((int)input[input_len] & 0x80U) == 0) {
          local_78 = (uint)charset_rev[(int)input[input_len]];
        }
        else {
          local_78 = 0xffffffff;
        }
        if (('`' < input[input_len]) && (input[input_len] < '{')) {
          bVar2 = true;
        }
        if (('@' < input[input_len]) && (input[input_len] < '[')) {
          bVar3 = true;
        }
        if (local_78 == 0xffffffff) {
          return 0;
        }
        uVar4 = bech32_polymod_step(i._4_4_);
        i._4_4_ = uVar4 ^ local_78;
        uVar7 = sVar1 + 7;
        sVar1 = input_len;
        if (uVar7 < sVar5) {
          data[input_len - (uVar6 + 1)] = (uint8_t)local_78;
        }
      }
      if ((bVar2) && (bVar3)) {
        hrp_local._4_4_ = 0;
      }
      else {
        if (is_bech32m != (_Bool *)0x0) {
          *is_bech32m = i._4_4_ == 0x2bc830a3;
        }
        local_79 = i._4_4_ == 1 || i._4_4_ == 0x2bc830a3;
        hrp_local._4_4_ = (uint)local_79;
      }
    }
    else {
      hrp_local._4_4_ = 0;
    }
  }
  return hrp_local._4_4_;
}

Assistant:

static int bech32_decode(char *hrp, uint8_t *data, size_t *data_len, const char *input, size_t max_input_len, bool *is_bech32m) {
    uint32_t chk = 1;
    size_t i;
    size_t input_len = strlen(input);
    size_t hrp_len;
    int have_lower = 0, have_upper = 0;
    if (input_len < 8 || input_len > max_input_len) {
        return 0;
    }
    *data_len = 0;
    while (*data_len < input_len && input[(input_len - 1) - *data_len] != '1') {
        ++(*data_len);
    }
    if (1 + *data_len >= input_len || *data_len < 6) {
        return 0;
    }
    hrp_len = input_len - (1 + *data_len);
    *(data_len) -= 6;
    for (i = 0; i < hrp_len; ++i) {
        int ch = input[i];
        if (ch < 33 || ch > 126) {
            return 0;
        }
        if (ch >= 'a' && ch <= 'z') {
            have_lower = 1;
        } else if (ch >= 'A' && ch <= 'Z') {
            have_upper = 1;
            ch = (ch - 'A') + 'a';
        }
        hrp[i] = ch;
        chk = bech32_polymod_step(chk) ^ (ch >> 5);
    }
    hrp[i] = 0;
    chk = bech32_polymod_step(chk);
    for (i = 0; i < hrp_len; ++i) {
        chk = bech32_polymod_step(chk) ^ (input[i] & 0x1f);
    }
    ++i;
    while (i < input_len) {
        int v = (input[i] & 0x80) ? -1 : charset_rev[(int)input[i]];
        if (input[i] >= 'a' && input[i] <= 'z') have_lower = 1;
        if (input[i] >= 'A' && input[i] <= 'Z') have_upper = 1;
        if (v == -1) {
            return 0;
        }
        chk = bech32_polymod_step(chk) ^ v;
        if (i + 6 < input_len) {
            data[i - (1 + hrp_len)] = v;
        }
        ++i;
    }
    if (have_lower && have_upper) {
        return 0;
    }
    if (is_bech32m != NULL) *is_bech32m = (chk == 0x2bc830a3);
    return (chk == 1) || (chk == 0x2bc830a3);
}